

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.cpp
# Opt level: O1

int ProcessStandardArguments(ImportData *fill,char **params,uint num)

{
  byte *pbVar1;
  int iVar2;
  size_t sVar3;
  ulong uVar4;
  char *pcVar5;
  long *local_50 [2];
  long local_40 [2];
  
  if (num != 0) {
    uVar4 = 0;
    do {
      pcVar5 = params[uVar4];
      printf("param = %s\n",pcVar5);
      iVar2 = strcmp(pcVar5,"-ptv");
      if ((iVar2 == 0) || (iVar2 = strcmp(pcVar5,"--pretransform-vertices"), iVar2 == 0)) {
        pbVar1 = (byte *)((long)&fill->ppFlags + 1);
        *pbVar1 = *pbVar1 | 1;
      }
      else {
        iVar2 = strcmp(pcVar5,"-gsn");
        if ((iVar2 == 0) || (iVar2 = strcmp(pcVar5,"--gen-smooth-normals"), iVar2 == 0)) {
          *(byte *)&fill->ppFlags = (byte)fill->ppFlags | 0x40;
        }
        else {
          iVar2 = strcmp(pcVar5,"-dn");
          if ((iVar2 == 0) || (iVar2 = strcmp(pcVar5,"--drop-normals"), iVar2 == 0)) {
            pbVar1 = (byte *)((long)&fill->ppFlags + 3);
            *pbVar1 = *pbVar1 | 0x40;
          }
          else {
            iVar2 = strcmp(pcVar5,"-gn");
            if ((iVar2 == 0) || (iVar2 = strcmp(pcVar5,"--gen-normals"), iVar2 == 0)) {
              *(byte *)&fill->ppFlags = (byte)fill->ppFlags | 0x20;
            }
            else {
              iVar2 = strcmp(pcVar5,"-jiv");
              if ((iVar2 == 0) || (iVar2 = strcmp(pcVar5,"--join-identical-vertices"), iVar2 == 0))
              {
                *(byte *)&fill->ppFlags = (byte)fill->ppFlags | 2;
              }
              else {
                iVar2 = strcmp(pcVar5,"-rrm");
                if ((iVar2 == 0) ||
                   (iVar2 = strcmp(pcVar5,"--remove-redundant-materials"), iVar2 == 0)) {
                  pbVar1 = (byte *)((long)&fill->ppFlags + 1);
                  *pbVar1 = *pbVar1 | 0x10;
                }
                else {
                  iVar2 = strcmp(pcVar5,"-fd");
                  if ((iVar2 == 0) || (iVar2 = strcmp(pcVar5,"--find-degenerates"), iVar2 == 0)) {
                    pbVar1 = (byte *)((long)&fill->ppFlags + 2);
                    *pbVar1 = *pbVar1 | 1;
                  }
                  else {
                    iVar2 = strcmp(pcVar5,"-slm");
                    if ((iVar2 == 0) || (iVar2 = strcmp(pcVar5,"--split-large-meshes"), iVar2 == 0))
                    {
                      *(byte *)&fill->ppFlags = (byte)fill->ppFlags | 0x80;
                    }
                    else {
                      iVar2 = strcmp(pcVar5,"-lbw");
                      if ((iVar2 == 0) ||
                         (iVar2 = strcmp(pcVar5,"--limit-bone-weights"), iVar2 == 0)) {
                        pbVar1 = (byte *)((long)&fill->ppFlags + 1);
                        *pbVar1 = *pbVar1 | 2;
                      }
                      else {
                        iVar2 = strcmp(pcVar5,"-vds");
                        if ((iVar2 == 0) ||
                           (iVar2 = strcmp(pcVar5,"--validate-data-structure"), iVar2 == 0)) {
                          pbVar1 = (byte *)((long)&fill->ppFlags + 1);
                          *pbVar1 = *pbVar1 | 4;
                        }
                        else {
                          iVar2 = strcmp(pcVar5,"-icl");
                          if ((iVar2 == 0) ||
                             (iVar2 = strcmp(pcVar5,"--improve-cache-locality"), iVar2 == 0)) {
                            pbVar1 = (byte *)((long)&fill->ppFlags + 1);
                            *pbVar1 = *pbVar1 | 8;
                          }
                          else {
                            iVar2 = strcmp(pcVar5,"-sbpt");
                            if ((iVar2 == 0) ||
                               (iVar2 = strcmp(pcVar5,"--sort-by-ptype"), iVar2 == 0)) {
                              pbVar1 = (byte *)((long)&fill->ppFlags + 1);
                              *pbVar1 = *pbVar1 | 0x80;
                            }
                            else {
                              iVar2 = strcmp(pcVar5,"-lh");
                              if ((iVar2 == 0) ||
                                 (iVar2 = strcmp(pcVar5,"--left-handed"), iVar2 == 0)) {
                                fill->ppFlags = fill->ppFlags | 0x1800004;
                              }
                              else {
                                iVar2 = strcmp(pcVar5,"-fuv");
                                if ((iVar2 == 0) || (iVar2 = strcmp(pcVar5,"--flip-uv"), iVar2 == 0)
                                   ) {
                                  pbVar1 = (byte *)((long)&fill->ppFlags + 2);
                                  *pbVar1 = *pbVar1 | 0x80;
                                }
                                else {
                                  iVar2 = strcmp(pcVar5,"-fwo");
                                  if ((iVar2 == 0) ||
                                     (iVar2 = strcmp(pcVar5,"--flip-winding-order"), iVar2 == 0)) {
                                    pbVar1 = (byte *)((long)&fill->ppFlags + 3);
                                    *pbVar1 = *pbVar1 | 1;
                                  }
                                  else {
                                    iVar2 = strcmp(pcVar5,"-tuv");
                                    if ((iVar2 == 0) ||
                                       (iVar2 = strcmp(pcVar5,"--transform-uv-coords"), iVar2 == 0))
                                    {
                                      pbVar1 = (byte *)((long)&fill->ppFlags + 2);
                                      *pbVar1 = *pbVar1 | 8;
                                    }
                                    else {
                                      iVar2 = strcmp(pcVar5,"-guv");
                                      if ((iVar2 == 0) ||
                                         (iVar2 = strcmp(pcVar5,"--gen-uvcoords"), iVar2 == 0)) {
                                        pbVar1 = (byte *)((long)&fill->ppFlags + 2);
                                        *pbVar1 = *pbVar1 | 4;
                                      }
                                      else {
                                        iVar2 = strcmp(pcVar5,"-fid");
                                        if ((iVar2 == 0) ||
                                           (iVar2 = strcmp(pcVar5,"--find-invalid-data"), iVar2 == 0
                                           )) {
                                          pbVar1 = (byte *)((long)&fill->ppFlags + 2);
                                          *pbVar1 = *pbVar1 | 2;
                                        }
                                        else {
                                          iVar2 = strcmp(pcVar5,"-fixn");
                                          if ((iVar2 == 0) ||
                                             (iVar2 = strcmp(pcVar5,"--fix-normals"), iVar2 == 0)) {
                                            pbVar1 = (byte *)((long)&fill->ppFlags + 1);
                                            *pbVar1 = *pbVar1 | 0x20;
                                          }
                                          else {
                                            iVar2 = strcmp(pcVar5,"-tri");
                                            if ((iVar2 == 0) ||
                                               (iVar2 = strcmp(pcVar5,"--triangulate"), iVar2 == 0))
                                            {
                                              *(byte *)&fill->ppFlags = (byte)fill->ppFlags | 8;
                                            }
                                            else {
                                              iVar2 = strcmp(pcVar5,"-cts");
                                              if ((iVar2 == 0) ||
                                                 (iVar2 = strcmp(pcVar5,"--calc-tangent-space"),
                                                 iVar2 == 0)) {
                                                *(byte *)&fill->ppFlags = (byte)fill->ppFlags | 1;
                                              }
                                              else {
                                                iVar2 = strcmp(pcVar5,"-fi");
                                                if ((iVar2 == 0) ||
                                                   (iVar2 = strcmp(pcVar5,"--find-instances"),
                                                   iVar2 == 0)) {
                                                  pbVar1 = (byte *)((long)&fill->ppFlags + 2);
                                                  *pbVar1 = *pbVar1 | 0x10;
                                                }
                                                else {
                                                  iVar2 = strcmp(pcVar5,"-og");
                                                  if ((iVar2 == 0) ||
                                                     (iVar2 = strcmp(pcVar5,"--optimize-graph"),
                                                     iVar2 == 0)) {
                                                    pbVar1 = (byte *)((long)&fill->ppFlags + 2);
                                                    *pbVar1 = *pbVar1 | 0x40;
                                                  }
                                                  else {
                                                    iVar2 = strcmp(pcVar5,"-om");
                                                    if ((iVar2 == 0) ||
                                                       (iVar2 = strcmp(pcVar5,"--optimize-meshes"),
                                                       iVar2 == 0)) {
                                                      pbVar1 = (byte *)((long)&fill->ppFlags + 2);
                                                      *pbVar1 = *pbVar1 | 0x20;
                                                    }
                                                    else {
                                                      iVar2 = strcmp(pcVar5,"-db");
                                                      if ((iVar2 == 0) ||
                                                         (iVar2 = strcmp(pcVar5,"--debone"),
                                                         iVar2 == 0)) {
                                                        pbVar1 = (byte *)((long)&fill->ppFlags + 3);
                                                        *pbVar1 = *pbVar1 | 4;
                                                      }
                                                      else {
                                                        iVar2 = strcmp(pcVar5,"-sbc");
                                                        if ((iVar2 == 0) ||
                                                           (iVar2 = strcmp(pcVar5,
                                                  "--split-by-bone-count"), iVar2 == 0)) {
                                                    pbVar1 = (byte *)((long)&fill->ppFlags + 3);
                                                    *pbVar1 = *pbVar1 | 2;
                                                  }
                                                  else {
                                                    iVar2 = strcmp(pcVar5,"-embtex");
                                                    if ((iVar2 == 0) ||
                                                       (iVar2 = strcmp(pcVar5,"--embed-textures"),
                                                       iVar2 == 0)) {
                                                      pbVar1 = (byte *)((long)&fill->ppFlags + 3);
                                                      *pbVar1 = *pbVar1 | 0x10;
                                                    }
                                                    else {
                                                      iVar2 = strcmp(pcVar5,"-gs");
                                                      if ((iVar2 == 0) ||
                                                         (iVar2 = strcmp(pcVar5,"--global-scale"),
                                                         iVar2 == 0)) {
                                                        pbVar1 = (byte *)((long)&fill->ppFlags + 3);
                                                        *pbVar1 = *pbVar1 | 8;
                                                      }
                                                      else {
                                                        iVar2 = strncmp(pcVar5,"-c",2);
                                                        if ((iVar2 == 0) ||
                                                           (iVar2 = strncmp(pcVar5,"--config=",9),
                                                           iVar2 == 0)) {
                                                          if (params[uVar4][1] == '-') {
                                                            pcVar5 = pcVar5 + 9;
                                                          }
                                                          else {
                                                            pcVar5 = pcVar5 + 2;
                                                          }
                                                          iVar2 = strncmp(pcVar5,"full",4);
                                                          if (iVar2 == 0) {
                                                            fill->ppFlags = fill->ppFlags | 0x379ecb
                                                            ;
                                                          }
                                                          else {
                                                            iVar2 = strncmp(pcVar5,"default",7);
                                                            if (iVar2 == 0) {
                                                              fill->ppFlags =
                                                                   fill->ppFlags | 0x79acb;
                                                            }
                                                            else {
                                                              iVar2 = strncmp(pcVar5,"fast",4);
                                                              if (iVar2 == 0) {
                                                                fill->ppFlags =
                                                                     fill->ppFlags | 0x4802b;
                                                              }
                                                            }
                                                          }
                                                        }
                                                        else {
                                                          iVar2 = strcmp(pcVar5,"-l");
                                                          if ((iVar2 == 0) ||
                                                             (iVar2 = strcmp(pcVar5,"--show-log"),
                                                             iVar2 == 0)) {
                                                            fill->showLog = true;
                                                          }
                                                          else {
                                                            iVar2 = strcmp(pcVar5,"-v");
                                                            if ((iVar2 == 0) ||
                                                               (iVar2 = strcmp(pcVar5,"--verbose"),
                                                               iVar2 == 0)) {
                                                              fill->verbose = true;
                                                            }
                                                            else {
                                                              iVar2 = strncmp(pcVar5,"--log-out=",10
                                                                             );
                                                              if ((iVar2 == 0) ||
                                                                 (iVar2 = strncmp(pcVar5,"-lo",3),
                                                                 iVar2 == 0)) {
                                                                pcVar5 = params[uVar4];
                                                                if (pcVar5[1] == '-') {
                                                                  pcVar5 = pcVar5 + 10;
                                                                }
                                                                else {
                                                                  pcVar5 = pcVar5 + 3;
                                                                }
                                                                local_50[0] = local_40;
                                                                sVar3 = strlen(pcVar5);
                                                                std::__cxx11::string::
                                                                _M_construct<char_const*>
                                                                          ((string *)local_50,pcVar5
                                                                           ,pcVar5 + sVar3);
                                                                std::__cxx11::string::operator=
                                                                          ((string *)&fill->logFile,
                                                                           (string *)local_50);
                                                                if (local_50[0] != local_40) {
                                                                  operator_delete(local_50[0],
                                                                                  local_40[0] + 1);
                                                                }
                                                                if ((fill->logFile)._M_string_length
                                                                    == 0) {
                                                                  std::__cxx11::string::operator=
                                                                            ((string *)
                                                                             &fill->logFile,
                                                                             "assimp-log.txt");
                                                                }
                                                              }
                                                            }
                                                          }
                                                        }
                                                      }
                                                    }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      uVar4 = uVar4 + 1;
    } while (num != uVar4);
  }
  if ((((fill->logFile)._M_string_length != 0) || (fill->showLog != false)) ||
     (fill->verbose == true)) {
    fill->log = true;
  }
  return 0;
}

Assistant:

int ProcessStandardArguments(
	ImportData& fill, 
	const char* const * params,
	unsigned int num)
{
	// -ptv    --pretransform-vertices
	// -gsn    --gen-smooth-normals
	// -gn     --gen-normals
	// -cts    --calc-tangent-space
	// -jiv    --join-identical-vertices
	// -rrm    --remove-redundant-materials
	// -fd     --find-degenerates
	// -slm    --split-large-meshes
	// -lbw    --limit-bone-weights
	// -vds    --validate-data-structure
	// -icl    --improve-cache-locality
	// -sbpt   --sort-by-ptype
	// -lh     --convert-to-lh
	// -fuv    --flip-uv
	// -fwo    --flip-winding-order
	// -tuv    --transform-uv-coords
	// -guv    --gen-uvcoords
	// -fid    --find-invalid-data
	// -fixn   --fix normals
	// -tri    --triangulate
	// -fi     --find-instances
	// -og     --optimize-graph
	// -om     --optimize-meshes
	// -db     --debone
	// -sbc    --split-by-bone-count
	// -gs	   --global-scale
	//
	// -c<file> --config-file=<file>

	for (unsigned int i = 0; i < num;++i) 
	{
        const char *param = params[ i ];
        printf( "param = %s\n", param );
		if (! strcmp( param, "-ptv") || ! strcmp( param, "--pretransform-vertices")) {
			fill.ppFlags |= aiProcess_PreTransformVertices;
		}
		else if (! strcmp( param, "-gsn") || ! strcmp( param, "--gen-smooth-normals")) {
			fill.ppFlags |= aiProcess_GenSmoothNormals;
		}
    else if (! strcmp( param, "-dn") || ! strcmp( param, "--drop-normals")) {
			fill.ppFlags |= aiProcess_DropNormals;
		}
		else if (! strcmp( param, "-gn") || ! strcmp( param, "--gen-normals")) {
			fill.ppFlags |= aiProcess_GenNormals;
		}
		else if (! strcmp( param, "-jiv") || ! strcmp( param, "--join-identical-vertices")) {
			fill.ppFlags |= aiProcess_JoinIdenticalVertices;
		}
		else if (! strcmp( param, "-rrm") || ! strcmp( param, "--remove-redundant-materials")) {
			fill.ppFlags |= aiProcess_RemoveRedundantMaterials;
		}
		else if (! strcmp( param, "-fd") || ! strcmp( param, "--find-degenerates")) {
			fill.ppFlags |= aiProcess_FindDegenerates;
		}
		else if (! strcmp( param, "-slm") || ! strcmp( param, "--split-large-meshes")) {
			fill.ppFlags |= aiProcess_SplitLargeMeshes;
		}
		else if (! strcmp( param, "-lbw") || ! strcmp( param, "--limit-bone-weights")) {
			fill.ppFlags |= aiProcess_LimitBoneWeights;
		}
		else if (! strcmp( param, "-vds") || ! strcmp( param, "--validate-data-structure")) {
			fill.ppFlags |= aiProcess_ValidateDataStructure;
		}
		else if (! strcmp( param, "-icl") || ! strcmp( param, "--improve-cache-locality")) {
			fill.ppFlags |= aiProcess_ImproveCacheLocality;
		}
		else if (! strcmp( param, "-sbpt") || ! strcmp( param, "--sort-by-ptype")) {
			fill.ppFlags |= aiProcess_SortByPType;
		}
		else if (! strcmp( param, "-lh") || ! strcmp( param, "--left-handed")) {
			fill.ppFlags |= aiProcess_ConvertToLeftHanded;
		}
		else if (! strcmp( param, "-fuv") || ! strcmp( param, "--flip-uv")) {
			fill.ppFlags |= aiProcess_FlipUVs;
		}
		else if (! strcmp( param, "-fwo") || ! strcmp( param, "--flip-winding-order")) {
			fill.ppFlags |= aiProcess_FlipWindingOrder;
		}
		else if (! strcmp( param, "-tuv") || ! strcmp( param, "--transform-uv-coords")) {
			fill.ppFlags |= aiProcess_TransformUVCoords;
		}
		else if (! strcmp( param, "-guv") || ! strcmp( param, "--gen-uvcoords")) {
			fill.ppFlags |= aiProcess_GenUVCoords;
		}
		else if (! strcmp( param, "-fid") || ! strcmp( param, "--find-invalid-data")) {
			fill.ppFlags |= aiProcess_FindInvalidData;
		}
		else if (! strcmp( param, "-fixn") || ! strcmp( param, "--fix-normals")) {
			fill.ppFlags |= aiProcess_FixInfacingNormals;
		}
		else if (! strcmp( param, "-tri") || ! strcmp( param, "--triangulate")) {
			fill.ppFlags |= aiProcess_Triangulate;
		}
		else if (! strcmp( param, "-cts") || ! strcmp( param, "--calc-tangent-space")) {
			fill.ppFlags |= aiProcess_CalcTangentSpace;
		}
		else if (! strcmp( param, "-fi") || ! strcmp( param, "--find-instances")) {
			fill.ppFlags |= aiProcess_FindInstances;
		}
		else if (! strcmp( param, "-og") || ! strcmp( param, "--optimize-graph")) {
			fill.ppFlags |= aiProcess_OptimizeGraph;
		}
		else if (! strcmp( param, "-om") || ! strcmp( param, "--optimize-meshes")) {
			fill.ppFlags |= aiProcess_OptimizeMeshes;
		}
		else if (! strcmp( param, "-db") || ! strcmp( param, "--debone")) {
			fill.ppFlags |= aiProcess_Debone;
		}
		else if (! strcmp( param, "-sbc") || ! strcmp( param, "--split-by-bone-count")) {
			fill.ppFlags |= aiProcess_SplitByBoneCount;
		}
		else if (!strcmp(param, "-embtex") || ! strcmp(param, "--embed-textures")) {
			fill.ppFlags |= aiProcess_EmbedTextures;
		}
		else if (!strcmp(param, "-gs") || ! strcmp(param, "--global-scale")) {
			fill.ppFlags |= aiProcess_GlobalScale;
		}
		else if (! strncmp( param, "-c",2) || ! strncmp( param, "--config=",9)) {
			const unsigned int ofs = (params[i][1] == '-' ? 9 : 2);

			// use default configurations
            if (!strncmp( param + ofs, "full", 4 )) {
                fill.ppFlags |= aiProcessPreset_TargetRealtime_MaxQuality;
            } else if (!strncmp( param + ofs, "default", 7 )) {
				fill.ppFlags |= aiProcessPreset_TargetRealtime_Quality;
			} else if (! strncmp( param +ofs,"fast",4)) {
				fill.ppFlags |= aiProcessPreset_TargetRealtime_Fast;
			}
		} else if (! strcmp( param, "-l") || ! strcmp( param, "--show-log")) {
			fill.showLog = true;
		}
		else if (! strcmp( param, "-v") || ! strcmp( param, "--verbose")) {
			fill.verbose = true;
		}
		else if (! strncmp( param, "--log-out=",10) || ! strncmp( param, "-lo",3)) {
			fill.logFile = std::string(params[i]+(params[i][1] == '-' ? 10 : 3));
			if (!fill.logFile.length()) {
				fill.logFile = "assimp-log.txt";
			}
		}
	}

	if (fill.logFile.length() || fill.showLog || fill.verbose) {
		fill.log = true;
	}

	return 0;
}